

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

void phmap::priv::map_slot_policy<cs_impl::any,cs_impl::any>::
     transfer<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
               (allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *alloc,slot_type *new_slot,
               slot_type *old_slot)

{
  (new_slot->value).first.mDat = (proxy *)0x0;
  (new_slot->value).first.mDat = (old_slot->value).first.mDat;
  (old_slot->value).first.mDat = (proxy *)0x0;
  (new_slot->value).second.mDat = (proxy *)0x0;
  (new_slot->value).second.mDat = (old_slot->value).second.mDat;
  (old_slot->value).second.mDat = (proxy *)0x0;
  std::pair<cs_impl::any,_cs_impl::any>::~pair((pair<cs_impl::any,_cs_impl::any> *)&old_slot->value)
  ;
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
			                     slot_type* old_slot)
			{
				emplace(new_slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(
					    *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
					        std::move(old_slot->value));
				}
				destroy(alloc, old_slot);
			}